

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_morton.cpp
# Opt level: O3

NodeRecord * __thiscall
embree::sse2::CreateMortonLeaf<4,_embree::InstancePrimitive>::operator()
          (NodeRecord *__return_storage_ptr__,CreateMortonLeaf<4,_embree::InstancePrimitive> *this,
          range<unsigned_int> *current,CachedAllocator *alloc)

{
  atomic<unsigned_long> *paVar1;
  pointer *pppTVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  uint uVar4;
  uint uVar5;
  FastAllocator *this_00;
  ThreadLocal *pTVar6;
  ThreadLocal2 *this_01;
  iterator __position;
  Instance *pIVar7;
  AffineSpace3ff *pAVar8;
  long lVar9;
  undefined8 *puVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined8 *puVar32;
  ulong uVar33;
  ulong uVar34;
  char *pcVar35;
  size_t sVar36;
  ulong uVar37;
  long lVar38;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar39;
  undefined1 auVar40 [12];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar41;
  float fVar43;
  float fVar46;
  float fVar47;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar60;
  float fVar61;
  float fVar62;
  undefined1 auVar59 [16];
  undefined1 auVar63 [16];
  float fVar64;
  float fVar68;
  float fVar69;
  undefined1 auVar65 [16];
  float fVar70;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float local_98;
  float local_78;
  float fStack_74;
  undefined8 *local_60;
  undefined8 *local_58;
  undefined1 local_50;
  ThreadLocal2 *local_48;
  char local_40;
  ThreadLocal2 *local_38;
  undefined1 auVar42 [16];
  
  uVar4 = current->_begin;
  uVar5 = current->_end;
  uVar33 = (ulong)(uVar5 - uVar4);
  local_60 = (undefined8 *)(uVar33 << 4);
  this_00 = alloc->alloc;
  pTVar6 = alloc->talloc1;
  this_01 = pTVar6->parent;
  if (this_00 != (this_01->alloc)._M_b._M_p) {
    local_40 = '\x01';
    local_48 = this_01;
    MutexSys::lock(&this_01->mutex);
    if ((this_01->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesUsed + (this_01->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((this_01->alloc0).end + (this_01->alloc1).end) -
           ((this_01->alloc0).cur + (this_01->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesWasted + (this_01->alloc0).bytesWasted;
      UNLOCK();
    }
    (this_01->alloc0).bytesUsed = 0;
    (this_01->alloc0).bytesWasted = 0;
    (this_01->alloc0).end = 0;
    (this_01->alloc0).allocBlockSize = 0;
    (this_01->alloc0).ptr = (char *)0x0;
    (this_01->alloc0).cur = 0;
    if (this_00 == (FastAllocator *)0x0) {
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
    }
    else {
      (this_01->alloc0).allocBlockSize = this_00->defaultBlockSize;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).allocBlockSize = this_00->defaultBlockSize;
    }
    LOCK();
    (this_01->alloc)._M_b._M_p = this_00;
    UNLOCK();
    local_58 = &FastAllocator::s_thread_local_allocators_lock;
    local_50 = 1;
    local_38 = this_01;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    __position._M_current =
         (this_00->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this_00->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&this_00->thread_local_allocators,__position,&local_38);
    }
    else {
      *__position._M_current = this_01;
      pppTVar2 = &(this_00->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar2 = *pppTVar2 + 1;
    }
    MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    if (local_40 == '\x01') {
      MutexSys::unlock(&local_48->mutex);
    }
  }
  puVar32 = local_60;
  pTVar6->bytesUsed = pTVar6->bytesUsed + (long)local_60;
  sVar36 = pTVar6->cur;
  uVar37 = (ulong)(-(int)sVar36 & 0xf);
  uVar34 = (long)local_60 + uVar37 + sVar36;
  pTVar6->cur = uVar34;
  if (pTVar6->end < uVar34) {
    pTVar6->cur = sVar36;
    puVar10 = (undefined8 *)pTVar6->allocBlockSize;
    if ((undefined8 *)((long)local_60 * 4) < puVar10 || (long)local_60 * 4 - (long)puVar10 == 0) {
      local_58 = puVar10;
      pcVar35 = (char *)FastAllocator::malloc(this_00,(size_t)&local_58);
      pTVar6->ptr = pcVar35;
      sVar36 = (pTVar6->end - pTVar6->cur) + pTVar6->bytesWasted;
      pTVar6->bytesWasted = sVar36;
      pTVar6->end = (size_t)local_58;
      pTVar6->cur = (size_t)puVar32;
      if (local_58 < puVar32) {
        pTVar6->cur = 0;
        local_58 = (undefined8 *)pTVar6->allocBlockSize;
        pcVar35 = (char *)FastAllocator::malloc(this_00,(size_t)&local_58);
        pTVar6->ptr = pcVar35;
        sVar36 = (pTVar6->end - pTVar6->cur) + pTVar6->bytesWasted;
        pTVar6->bytesWasted = sVar36;
        pTVar6->end = (size_t)local_58;
        pTVar6->cur = (size_t)puVar32;
        if (local_58 < puVar32) {
          pTVar6->cur = 0;
          pcVar35 = (char *)0x0;
          goto LAB_00bef16c;
        }
      }
      pTVar6->bytesWasted = sVar36;
    }
    else {
      pcVar35 = (char *)FastAllocator::malloc(this_00,(size_t)&local_60);
    }
  }
  else {
    pTVar6->bytesWasted = pTVar6->bytesWasted + uVar37;
    pcVar35 = pTVar6->ptr + (uVar34 - (long)local_60);
  }
LAB_00bef16c:
  aVar41 = _DAT_01f7aa00;
  aVar39 = _DAT_01f7aa00;
  if (uVar5 == uVar4) {
    auVar40 = DAT_01f7a9f0._0_12_;
  }
  else {
    pIVar7 = this->mesh;
    lVar38 = 0;
    auVar42 = _DAT_01f7a9f0;
    do {
      pAVar8 = pIVar7->local2world;
      if ((pIVar7->super_Geometry).field_8.field_0x1 == '\x01') {
        fVar43 = (pAVar8->p).field_0.m128[3];
        fVar46 = (pAVar8->l).vx.field_0.m128[3];
        fVar47 = (pAVar8->l).vy.field_0.m128[3];
        fVar52 = (pAVar8->l).vz.field_0.m128[3];
        aVar3 = (pAVar8->l).vx.field_0.field_1;
        fVar80 = (pAVar8->l).vy.field_0.m128[0];
        fVar82 = (pAVar8->l).vy.field_0.m128[1];
        fVar58 = fVar46 * fVar47 + fVar43 * fVar52;
        fVar51 = fVar46 * fVar47 - fVar43 * fVar52;
        fVar60 = fVar43 * fVar43 + fVar46 * fVar46 + -fVar47 * fVar47 + -fVar52 * fVar52;
        fVar84 = fVar43 * fVar43 - fVar46 * fVar46;
        fVar62 = fVar47 * fVar47 + fVar84 + -fVar52 * fVar52;
        fVar48 = fVar46 * fVar52 - fVar43 * fVar47;
        fVar56 = fVar43 * fVar47 + fVar46 * fVar52;
        fVar53 = fVar47 * fVar52 + fVar43 * fVar46;
        fVar79 = fVar47 * fVar52 - fVar43 * fVar46;
        fVar50 = fVar52 * fVar52 + fVar84 + -fVar47 * fVar47;
        fVar43 = (pAVar8->l).vz.field_0.m128[0];
        fVar46 = (pAVar8->l).vz.field_0.m128[1];
        fVar47 = (pAVar8->l).vz.field_0.m128[2];
        fVar58 = fVar58 + fVar58;
        fVar48 = fVar48 + fVar48;
        fVar52 = (pAVar8->p).field_0.m128[0];
        fVar84 = (pAVar8->p).field_0.m128[1];
        fVar49 = (pAVar8->p).field_0.m128[2];
        fVar51 = fVar51 + fVar51;
        fVar53 = fVar53 + fVar53;
        fVar56 = fVar56 + fVar56;
        fVar79 = fVar79 + fVar79;
        fVar81 = fVar60 * 1.0 + fVar58 * 0.0 + fVar48 * 0.0;
        fVar83 = fVar60 * 0.0 + fVar58 * 1.0 + fVar48 * 0.0;
        fVar54 = fVar60 * 0.0 + fVar58 * 0.0 + fVar48 * 1.0;
        fVar55 = fVar60 * 0.0 + fVar58 * 0.0 + fVar48 * 0.0;
        fVar58 = fVar51 * 1.0 + fVar62 * 0.0 + fVar53 * 0.0;
        fVar60 = fVar51 * 0.0 + fVar62 * 1.0 + fVar53 * 0.0;
        fVar61 = fVar51 * 0.0 + fVar62 * 0.0 + fVar53 * 1.0;
        fVar62 = fVar51 * 0.0 + fVar62 * 0.0 + fVar53 * 0.0;
        fVar68 = fVar56 * 1.0 + fVar79 * 0.0 + fVar50 * 0.0;
        fVar69 = fVar56 * 0.0 + fVar79 * 1.0 + fVar50 * 0.0;
        fVar70 = fVar56 * 0.0 + fVar79 * 0.0 + fVar50 * 1.0;
        fVar79 = fVar56 * 0.0 + fVar79 * 0.0 + fVar50 * 0.0;
        local_98 = aVar3.x;
        fVar48 = local_98 * fVar81 + fVar58 * 0.0 + fVar68 * 0.0;
        fVar50 = local_98 * fVar83 + fVar60 * 0.0 + fVar69 * 0.0;
        fVar51 = local_98 * fVar54 + fVar61 * 0.0 + fVar70 * 0.0;
        fVar53 = local_98 * fVar55 + fVar62 * 0.0 + fVar79 * 0.0;
        local_78 = aVar3.y;
        fStack_74 = aVar3.z;
        fVar57 = fVar80 * fVar81 + fVar82 * fVar58 + fVar68 * 0.0;
        fVar64 = fVar80 * fVar83 + fVar82 * fVar60 + fVar69 * 0.0;
        fVar74 = fVar80 * fVar54 + fVar82 * fVar61 + fVar70 * 0.0;
        fVar77 = fVar80 * fVar55 + fVar82 * fVar62 + fVar79 * 0.0;
        fVar78 = fVar43 * fVar81 + fVar46 * fVar58 + fVar47 * fVar68;
        fVar86 = fVar43 * fVar83 + fVar46 * fVar60 + fVar47 * fVar69;
        fVar85 = fVar43 * fVar54 + fVar46 * fVar61 + fVar47 * fVar70;
        fVar87 = fVar43 * fVar55 + fVar46 * fVar62 + fVar47 * fVar79;
        fVar46 = fVar52 * fVar81 + fVar84 * fVar58 + fVar49 * fVar68 + local_78 + 0.0;
        fVar80 = fVar52 * fVar83 + fVar84 * fVar60 + fVar49 * fVar69 + fStack_74 + 0.0;
        fVar82 = fVar52 * fVar54 + fVar84 * fVar61 + fVar49 * fVar70 +
                 (pAVar8->l).vy.field_0.m128[2] + 0.0;
        fVar49 = fVar52 * fVar55 + fVar84 * fVar62 + fVar49 * fVar79 + 0.0;
        lVar9 = *(long *)&(pIVar7->super_Geometry).field_0x58;
        auVar44 = minps(*(undefined1 (*) [16])(lVar9 + 0x10),*(undefined1 (*) [16])(lVar9 + 0x30));
        auVar63 = maxps(*(undefined1 (*) [16])(lVar9 + 0x20),*(undefined1 (*) [16])(lVar9 + 0x40));
        fVar62 = auVar44._0_4_;
        fVar69 = auVar44._4_4_;
        fVar43 = auVar44._8_4_;
        fVar68 = fVar43 * fVar78 + fVar46;
        fVar70 = fVar43 * fVar86 + fVar80;
        fVar71 = fVar43 * fVar85 + fVar82;
        fVar72 = fVar43 * fVar87 + fVar49;
        fVar73 = fVar69 * fVar57;
        fVar75 = fVar69 * fVar64;
        fVar76 = fVar69 * fVar74;
        fVar69 = fVar69 * fVar77;
        fVar79 = fVar73 + fVar68;
        fVar81 = fVar75 + fVar70;
        fVar83 = fVar76 + fVar71;
        fVar54 = fVar69 + fVar72;
        fVar58 = fVar62 * fVar48;
        fVar60 = fVar62 * fVar50;
        fVar61 = fVar62 * fVar51;
        fVar62 = fVar62 * fVar53;
        fVar43 = fVar58 + fVar79;
        fVar47 = fVar60 + fVar81;
        fVar52 = fVar61 + fVar83;
        fVar84 = fVar62 + fVar54;
        auVar44._4_4_ = fVar47;
        auVar44._0_4_ = fVar43;
        auVar44._8_4_ = fVar52;
        auVar44._12_4_ = fVar84;
        auVar44 = minps(_DAT_01f7a9f0,auVar44);
        auVar65._4_4_ = fVar47;
        auVar65._0_4_ = fVar43;
        auVar65._8_4_ = fVar52;
        auVar65._12_4_ = fVar84;
        auVar65 = maxps((undefined1  [16])aVar41,auVar65);
        fVar55 = auVar63._0_4_;
        fVar56 = auVar63._4_4_;
        fVar43 = auVar63._8_4_;
        fVar46 = fVar43 * fVar78 + fVar46;
        fVar80 = fVar43 * fVar86 + fVar80;
        fVar82 = fVar43 * fVar85 + fVar82;
        fVar49 = fVar43 * fVar87 + fVar49;
        fVar73 = fVar73 + fVar46;
        fVar75 = fVar75 + fVar80;
        fVar76 = fVar76 + fVar82;
        fVar69 = fVar69 + fVar49;
        fVar43 = fVar58 + fVar73;
        fVar47 = fVar60 + fVar75;
        fVar52 = fVar61 + fVar76;
        fVar84 = fVar62 + fVar69;
        auVar20._4_4_ = fVar47;
        auVar20._0_4_ = fVar43;
        auVar20._8_4_ = fVar52;
        auVar20._12_4_ = fVar84;
        auVar44 = minps(auVar44,auVar20);
        auVar21._4_4_ = fVar47;
        auVar21._0_4_ = fVar43;
        auVar21._8_4_ = fVar52;
        auVar21._12_4_ = fVar84;
        auVar65 = maxps(auVar65,auVar21);
        fVar57 = fVar56 * fVar57;
        fVar64 = fVar56 * fVar64;
        fVar74 = fVar56 * fVar74;
        fVar56 = fVar56 * fVar77;
        fVar68 = fVar68 + fVar57;
        fVar70 = fVar70 + fVar64;
        fVar71 = fVar71 + fVar74;
        fVar72 = fVar72 + fVar56;
        fVar43 = fVar58 + fVar68;
        fVar47 = fVar60 + fVar70;
        fVar52 = fVar61 + fVar71;
        fVar84 = fVar62 + fVar72;
        auVar22._4_4_ = fVar47;
        auVar22._0_4_ = fVar43;
        auVar22._8_4_ = fVar52;
        auVar22._12_4_ = fVar84;
        auVar44 = minps(auVar44,auVar22);
        auVar23._4_4_ = fVar47;
        auVar23._0_4_ = fVar43;
        auVar23._8_4_ = fVar52;
        auVar23._12_4_ = fVar84;
        auVar65 = maxps(auVar65,auVar23);
        fVar57 = fVar57 + fVar46;
        fVar64 = fVar64 + fVar80;
        fVar74 = fVar74 + fVar82;
        fVar56 = fVar56 + fVar49;
        fVar58 = fVar58 + fVar57;
        fVar60 = fVar60 + fVar64;
        fVar61 = fVar61 + fVar74;
        fVar62 = fVar62 + fVar56;
        auVar63._4_4_ = fVar60;
        auVar63._0_4_ = fVar58;
        auVar63._8_4_ = fVar61;
        auVar63._12_4_ = fVar62;
        auVar44 = minps(auVar44,auVar63);
        auVar17._4_4_ = fVar60;
        auVar17._0_4_ = fVar58;
        auVar17._8_4_ = fVar61;
        auVar17._12_4_ = fVar62;
        auVar65 = maxps(auVar65,auVar17);
        fVar48 = fVar55 * fVar48;
        fVar50 = fVar55 * fVar50;
        fVar51 = fVar55 * fVar51;
        fVar55 = fVar55 * fVar53;
        fVar79 = fVar79 + fVar48;
        fVar81 = fVar81 + fVar50;
        fVar83 = fVar83 + fVar51;
        fVar54 = fVar54 + fVar55;
        auVar18._4_4_ = fVar81;
        auVar18._0_4_ = fVar79;
        auVar18._8_4_ = fVar83;
        auVar18._12_4_ = fVar54;
        auVar44 = minps(auVar44,auVar18);
        auVar19._4_4_ = fVar81;
        auVar19._0_4_ = fVar79;
        auVar19._8_4_ = fVar83;
        auVar19._12_4_ = fVar54;
        auVar65 = maxps(auVar65,auVar19);
        fVar73 = fVar73 + fVar48;
        fVar75 = fVar75 + fVar50;
        fVar76 = fVar76 + fVar51;
        fVar69 = fVar69 + fVar55;
        auVar26._4_4_ = fVar75;
        auVar26._0_4_ = fVar73;
        auVar26._8_4_ = fVar76;
        auVar26._12_4_ = fVar69;
        auVar44 = minps(auVar44,auVar26);
        auVar27._4_4_ = fVar75;
        auVar27._0_4_ = fVar73;
        auVar27._8_4_ = fVar76;
        auVar27._12_4_ = fVar69;
        auVar65 = maxps(auVar65,auVar27);
        auVar67._0_4_ = fVar68 + fVar48;
        auVar67._4_4_ = fVar70 + fVar50;
        auVar67._8_4_ = fVar71 + fVar51;
        auVar67._12_4_ = fVar72 + fVar55;
        auVar44 = minps(auVar44,auVar67);
        auVar65 = maxps(auVar65,auVar67);
        auVar59._0_4_ = fVar48 + fVar57;
        auVar59._4_4_ = fVar50 + fVar64;
        auVar59._8_4_ = fVar51 + fVar74;
        auVar59._12_4_ = fVar55 + fVar56;
        auVar44 = minps(auVar44,auVar59);
        auVar65 = maxps(auVar65,auVar59);
      }
      else {
        fVar43 = (pAVar8->l).vx.field_0.m128[0];
        fVar46 = (pAVar8->l).vx.field_0.m128[1];
        fVar47 = (pAVar8->l).vx.field_0.m128[2];
        fVar52 = (pAVar8->l).vx.field_0.m128[3];
        fVar80 = (pAVar8->l).vy.field_0.m128[0];
        fVar82 = (pAVar8->l).vy.field_0.m128[1];
        fVar84 = (pAVar8->l).vy.field_0.m128[2];
        fVar49 = (pAVar8->l).vy.field_0.m128[3];
        fVar48 = (pAVar8->l).vz.field_0.m128[0];
        fVar50 = (pAVar8->l).vz.field_0.m128[1];
        fVar51 = (pAVar8->l).vz.field_0.m128[2];
        fVar53 = (pAVar8->l).vz.field_0.m128[3];
        fVar58 = (pAVar8->p).field_0.m128[0];
        fVar60 = (pAVar8->p).field_0.m128[1];
        fVar61 = (pAVar8->p).field_0.m128[2];
        fVar62 = (pAVar8->p).field_0.m128[3];
        lVar9 = *(long *)&(pIVar7->super_Geometry).field_0x58;
        auVar65 = minps(*(undefined1 (*) [16])(lVar9 + 0x10),*(undefined1 (*) [16])(lVar9 + 0x30));
        auVar44 = maxps(*(undefined1 (*) [16])(lVar9 + 0x20),*(undefined1 (*) [16])(lVar9 + 0x40));
        fVar57 = auVar65._0_4_;
        fVar74 = auVar65._4_4_;
        fVar79 = auVar65._8_4_;
        fVar64 = fVar79 * fVar48 + fVar58;
        fVar68 = fVar79 * fVar50 + fVar60;
        fVar69 = fVar79 * fVar51 + fVar61;
        fVar70 = fVar79 * fVar53 + fVar62;
        fVar71 = fVar74 * fVar80;
        fVar72 = fVar74 * fVar82;
        fVar73 = fVar74 * fVar84;
        fVar74 = fVar74 * fVar49;
        fVar75 = fVar71 + fVar64;
        fVar76 = fVar72 + fVar68;
        fVar77 = fVar73 + fVar69;
        fVar78 = fVar74 + fVar70;
        fVar54 = fVar57 * fVar43;
        fVar55 = fVar57 * fVar46;
        fVar56 = fVar57 * fVar47;
        fVar57 = fVar57 * fVar52;
        fVar79 = fVar54 + fVar75;
        fVar81 = fVar55 + fVar76;
        fVar83 = fVar56 + fVar77;
        fVar86 = fVar57 + fVar78;
        auVar30._4_4_ = fVar81;
        auVar30._0_4_ = fVar79;
        auVar30._8_4_ = fVar83;
        auVar30._12_4_ = fVar86;
        auVar65 = minps(_DAT_01f7a9f0,auVar30);
        auVar31._4_4_ = fVar81;
        auVar31._0_4_ = fVar79;
        auVar31._8_4_ = fVar83;
        auVar31._12_4_ = fVar86;
        auVar63 = maxps((undefined1  [16])aVar41,auVar31);
        fVar79 = auVar44._0_4_;
        fVar81 = auVar44._4_4_;
        fVar83 = auVar44._8_4_;
        fVar58 = fVar83 * fVar48 + fVar58;
        fVar60 = fVar83 * fVar50 + fVar60;
        fVar61 = fVar83 * fVar51 + fVar61;
        fVar62 = fVar83 * fVar53 + fVar62;
        fVar71 = fVar71 + fVar58;
        fVar72 = fVar72 + fVar60;
        fVar73 = fVar73 + fVar61;
        fVar74 = fVar74 + fVar62;
        fVar48 = fVar54 + fVar71;
        fVar50 = fVar55 + fVar72;
        fVar51 = fVar56 + fVar73;
        fVar53 = fVar57 + fVar74;
        auVar11._4_4_ = fVar50;
        auVar11._0_4_ = fVar48;
        auVar11._8_4_ = fVar51;
        auVar11._12_4_ = fVar53;
        auVar44 = minps(auVar65,auVar11);
        auVar12._4_4_ = fVar50;
        auVar12._0_4_ = fVar48;
        auVar12._8_4_ = fVar51;
        auVar12._12_4_ = fVar53;
        auVar65 = maxps(auVar63,auVar12);
        fVar80 = fVar81 * fVar80;
        fVar82 = fVar81 * fVar82;
        fVar84 = fVar81 * fVar84;
        fVar81 = fVar81 * fVar49;
        fVar64 = fVar64 + fVar80;
        fVar68 = fVar68 + fVar82;
        fVar69 = fVar69 + fVar84;
        fVar70 = fVar70 + fVar81;
        fVar49 = fVar54 + fVar64;
        fVar48 = fVar55 + fVar68;
        fVar50 = fVar56 + fVar69;
        fVar51 = fVar57 + fVar70;
        auVar13._4_4_ = fVar48;
        auVar13._0_4_ = fVar49;
        auVar13._8_4_ = fVar50;
        auVar13._12_4_ = fVar51;
        auVar44 = minps(auVar44,auVar13);
        auVar14._4_4_ = fVar48;
        auVar14._0_4_ = fVar49;
        auVar14._8_4_ = fVar50;
        auVar14._12_4_ = fVar51;
        auVar65 = maxps(auVar65,auVar14);
        fVar80 = fVar80 + fVar58;
        fVar82 = fVar82 + fVar60;
        fVar84 = fVar84 + fVar61;
        fVar81 = fVar81 + fVar62;
        fVar54 = fVar54 + fVar80;
        fVar55 = fVar55 + fVar82;
        fVar56 = fVar56 + fVar84;
        fVar57 = fVar57 + fVar81;
        auVar15._4_4_ = fVar55;
        auVar15._0_4_ = fVar54;
        auVar15._8_4_ = fVar56;
        auVar15._12_4_ = fVar57;
        auVar44 = minps(auVar44,auVar15);
        auVar16._4_4_ = fVar55;
        auVar16._0_4_ = fVar54;
        auVar16._8_4_ = fVar56;
        auVar16._12_4_ = fVar57;
        auVar65 = maxps(auVar65,auVar16);
        fVar43 = fVar79 * fVar43;
        fVar46 = fVar79 * fVar46;
        fVar47 = fVar79 * fVar47;
        fVar79 = fVar79 * fVar52;
        fVar75 = fVar75 + fVar43;
        fVar76 = fVar76 + fVar46;
        fVar77 = fVar77 + fVar47;
        fVar78 = fVar78 + fVar79;
        auVar28._4_4_ = fVar76;
        auVar28._0_4_ = fVar75;
        auVar28._8_4_ = fVar77;
        auVar28._12_4_ = fVar78;
        auVar44 = minps(auVar44,auVar28);
        auVar29._4_4_ = fVar76;
        auVar29._0_4_ = fVar75;
        auVar29._8_4_ = fVar77;
        auVar29._12_4_ = fVar78;
        auVar65 = maxps(auVar65,auVar29);
        fVar71 = fVar71 + fVar43;
        fVar72 = fVar72 + fVar46;
        fVar73 = fVar73 + fVar47;
        fVar74 = fVar74 + fVar79;
        auVar24._4_4_ = fVar72;
        auVar24._0_4_ = fVar71;
        auVar24._8_4_ = fVar73;
        auVar24._12_4_ = fVar74;
        auVar44 = minps(auVar44,auVar24);
        auVar25._4_4_ = fVar72;
        auVar25._0_4_ = fVar71;
        auVar25._8_4_ = fVar73;
        auVar25._12_4_ = fVar74;
        auVar65 = maxps(auVar65,auVar25);
        auVar66._0_4_ = fVar64 + fVar43;
        auVar66._4_4_ = fVar68 + fVar46;
        auVar66._8_4_ = fVar69 + fVar47;
        auVar66._12_4_ = fVar70 + fVar79;
        auVar44 = minps(auVar44,auVar66);
        auVar65 = maxps(auVar65,auVar66);
        auVar45._0_4_ = fVar43 + fVar80;
        auVar45._4_4_ = fVar46 + fVar82;
        auVar45._8_4_ = fVar47 + fVar84;
        auVar45._12_4_ = fVar79 + fVar81;
        auVar44 = minps(auVar44,auVar45);
        auVar65 = maxps(auVar65,auVar45);
      }
      aVar39.m128 = (__m128)maxps(aVar39.m128,auVar65);
      auVar42 = minps(auVar42,auVar44);
      auVar40 = auVar42._0_12_;
      uVar4 = this->geomID_;
      *(Instance **)(pcVar35 + lVar38) = pIVar7;
      *(uint *)(pcVar35 + lVar38 + 8) = uVar4;
      lVar38 = lVar38 + 0x10;
    } while ((uVar33 + (uVar33 == 0)) * 0x10 != lVar38);
  }
  uVar34 = 7;
  if (uVar33 < 7) {
    uVar34 = uVar33;
  }
  aVar41.m128[3] = (float)(current->_end - current->_begin);
  aVar41._0_12_ = auVar40;
  (__return_storage_ptr__->ref).ptr = uVar34 | (ulong)pcVar35 | 8;
  (__return_storage_ptr__->bounds).lower.field_0 = aVar41;
  (__return_storage_ptr__->bounds).upper.field_0 = aVar39;
  return __return_storage_ptr__;
}

Assistant:

operator() (const range<unsigned>& current, const FastAllocator::CachedAllocator& alloc)
      {
        vfloat4 lower(pos_inf);
        vfloat4 upper(neg_inf);
        size_t items = current.size();
        size_t start = current.begin();
        assert(items <= 1);
        
        /* allocate leaf node */
        InstancePrimitive* accel = (InstancePrimitive*) alloc.malloc1(items*sizeof(InstancePrimitive),BVH::byteAlignment);
        NodeRef ref = BVH::encodeLeaf((char*)accel,items);
        const Instance* instance = this->mesh;
        
        BBox3fa bounds = empty;
        for (size_t i=0; i<items; i++)
        {
          const unsigned int primID = morton[start+i].index; 
          bounds.extend(instance->bounds(primID));
          new (&accel[i]) InstancePrimitive(instance, geomID_);
        }

        BBox3fx box_o = (BBox3fx&)bounds;
#if ROTATE_TREE
        if (N == 4)
          box_o.lower.a = current.size();
#endif
        return NodeRecord(ref,box_o);
      }